

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void avx::Threshold(uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *outY,
                   uint8_t *outYEnd,uint8_t minThreshold,uint8_t maxThreshold,uint32_t simdWidth,
                   uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  byte bVar12;
  undefined1 uVar13;
  undefined1 *puVar14;
  undefined8 *in_RCX;
  ulong *in_RDX;
  uint in_ESI;
  uint in_EDI;
  undefined8 *in_R8;
  byte in_R9B;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint8_t *outXEnd_1;
  undefined3 in_stack_00000011;
  simd *src1End_1;
  simd *dst_1;
  simd *src1_1;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  simd data;
  simd *src1End;
  simd *dst;
  simd *src1;
  simd minCompare;
  char minCompareValue;
  simd maxCompare;
  char maxCompareValue;
  simd notMask;
  char notMaskValue;
  simd shiftMask;
  char shiftMaskValue;
  undefined1 *local_590;
  byte *local_588;
  undefined8 *local_548;
  ulong *local_540;
  undefined1 *local_530;
  byte *local_528;
  undefined8 *local_4f0;
  ulong *local_4e8;
  undefined8 *local_3e8;
  ulong *local_3e0;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  ulong local_1c0;
  ulong uStack_1b8;
  ulong uStack_1b0;
  ulong uStack_1a8;
  
  auVar2 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
  auVar2 = vpinsrb_avx(auVar2,0x80,2);
  auVar2 = vpinsrb_avx(auVar2,0x80,3);
  auVar2 = vpinsrb_avx(auVar2,0x80,4);
  auVar2 = vpinsrb_avx(auVar2,0x80,5);
  auVar2 = vpinsrb_avx(auVar2,0x80,6);
  auVar2 = vpinsrb_avx(auVar2,0x80,7);
  auVar2 = vpinsrb_avx(auVar2,0x80,8);
  auVar2 = vpinsrb_avx(auVar2,0x80,9);
  auVar2 = vpinsrb_avx(auVar2,0x80,10);
  auVar2 = vpinsrb_avx(auVar2,0x80,0xb);
  auVar2 = vpinsrb_avx(auVar2,0x80,0xc);
  auVar2 = vpinsrb_avx(auVar2,0x80,0xd);
  auVar2 = vpinsrb_avx(auVar2,0x80,0xe);
  auVar2 = vpinsrb_avx(auVar2,0x80,0xf);
  auVar17 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
  auVar17 = vpinsrb_avx(auVar17,0x80,2);
  auVar17 = vpinsrb_avx(auVar17,0x80,3);
  auVar17 = vpinsrb_avx(auVar17,0x80,4);
  auVar17 = vpinsrb_avx(auVar17,0x80,5);
  auVar17 = vpinsrb_avx(auVar17,0x80,6);
  auVar17 = vpinsrb_avx(auVar17,0x80,7);
  auVar17 = vpinsrb_avx(auVar17,0x80,8);
  auVar17 = vpinsrb_avx(auVar17,0x80,9);
  auVar17 = vpinsrb_avx(auVar17,0x80,10);
  auVar17 = vpinsrb_avx(auVar17,0x80,0xb);
  auVar17 = vpinsrb_avx(auVar17,0x80,0xc);
  auVar17 = vpinsrb_avx(auVar17,0x80,0xd);
  auVar17 = vpinsrb_avx(auVar17,0x80,0xe);
  auVar17 = vpinsrb_avx(auVar17,0x80,0xf);
  local_1c0 = auVar2._0_8_;
  uStack_1b8 = auVar2._8_8_;
  uStack_1b0 = auVar17._0_8_;
  uStack_1a8 = auVar17._8_8_;
  auVar2 = vpinsrb_avx(ZEXT116(0xff),0xff,1);
  auVar2 = vpinsrb_avx(auVar2,0xff,2);
  auVar2 = vpinsrb_avx(auVar2,0xff,3);
  auVar2 = vpinsrb_avx(auVar2,0xff,4);
  auVar2 = vpinsrb_avx(auVar2,0xff,5);
  auVar2 = vpinsrb_avx(auVar2,0xff,6);
  auVar2 = vpinsrb_avx(auVar2,0xff,7);
  auVar2 = vpinsrb_avx(auVar2,0xff,8);
  auVar2 = vpinsrb_avx(auVar2,0xff,9);
  auVar2 = vpinsrb_avx(auVar2,0xff,10);
  auVar2 = vpinsrb_avx(auVar2,0xff,0xb);
  auVar2 = vpinsrb_avx(auVar2,0xff,0xc);
  auVar2 = vpinsrb_avx(auVar2,0xff,0xd);
  auVar2 = vpinsrb_avx(auVar2,0xff,0xe);
  auVar2 = vpinsrb_avx(auVar2,0xff,0xf);
  auVar17 = vpinsrb_avx(ZEXT116(0xff),0xff,1);
  auVar17 = vpinsrb_avx(auVar17,0xff,2);
  auVar17 = vpinsrb_avx(auVar17,0xff,3);
  auVar17 = vpinsrb_avx(auVar17,0xff,4);
  auVar17 = vpinsrb_avx(auVar17,0xff,5);
  auVar17 = vpinsrb_avx(auVar17,0xff,6);
  auVar17 = vpinsrb_avx(auVar17,0xff,7);
  auVar17 = vpinsrb_avx(auVar17,0xff,8);
  auVar17 = vpinsrb_avx(auVar17,0xff,9);
  auVar17 = vpinsrb_avx(auVar17,0xff,10);
  auVar17 = vpinsrb_avx(auVar17,0xff,0xb);
  auVar17 = vpinsrb_avx(auVar17,0xff,0xc);
  auVar17 = vpinsrb_avx(auVar17,0xff,0xd);
  auVar17 = vpinsrb_avx(auVar17,0xff,0xe);
  auVar17 = vpinsrb_avx(auVar17,0xff,0xf);
  uStack_1f0 = auVar17._0_8_;
  uStack_1e8 = auVar17._8_8_;
  bVar12 = (byte)outXEnd_1 + 0x80;
  auVar17 = vpinsrb_avx(ZEXT116(bVar12),(uint)bVar12,1);
  auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,2);
  auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,3);
  auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,4);
  auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,5);
  auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,6);
  auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,7);
  auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,8);
  auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,9);
  auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,10);
  auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,0xb);
  auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,0xc);
  auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,0xd);
  auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,0xe);
  auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,0xf);
  auVar16 = vpinsrb_avx(ZEXT116(bVar12),(uint)bVar12,1);
  auVar16 = vpinsrb_avx(auVar16,(uint)bVar12,2);
  auVar16 = vpinsrb_avx(auVar16,(uint)bVar12,3);
  auVar16 = vpinsrb_avx(auVar16,(uint)bVar12,4);
  auVar16 = vpinsrb_avx(auVar16,(uint)bVar12,5);
  auVar16 = vpinsrb_avx(auVar16,(uint)bVar12,6);
  auVar16 = vpinsrb_avx(auVar16,(uint)bVar12,7);
  auVar16 = vpinsrb_avx(auVar16,(uint)bVar12,8);
  auVar16 = vpinsrb_avx(auVar16,(uint)bVar12,9);
  auVar16 = vpinsrb_avx(auVar16,(uint)bVar12,10);
  auVar16 = vpinsrb_avx(auVar16,(uint)bVar12,0xb);
  auVar16 = vpinsrb_avx(auVar16,(uint)bVar12,0xc);
  auVar16 = vpinsrb_avx(auVar16,(uint)bVar12,0xd);
  auVar16 = vpinsrb_avx(auVar16,(uint)bVar12,0xe);
  auVar16 = vpinsrb_avx(auVar16,(uint)bVar12,0xf);
  auVar16 = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar16;
  auVar17 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar17;
  uStack_230 = auVar17._0_8_;
  uStack_228 = auVar17._8_8_;
  local_3e8 = in_RCX;
  local_3e0 = in_RDX;
  if (in_R9B == 0) {
    for (; local_3e8 != in_R8; local_3e8 = (undefined8 *)((long)local_3e8 + (ulong)in_ESI)) {
      local_548 = local_3e8;
      for (local_540 = local_3e0; local_540 != local_3e0 + (ulong)_maxThreshold * 4;
          local_540 = local_540 + 4) {
        auVar7._8_8_ = local_540[1] ^ uStack_1b8;
        auVar7._0_8_ = *local_540 ^ local_1c0;
        auVar7._16_8_ = local_540[2] ^ uStack_1b0;
        auVar7._24_8_ = local_540[3] ^ uStack_1a8;
        auVar15._16_8_ = uStack_230;
        auVar15._0_16_ = auVar16;
        auVar15._24_8_ = uStack_228;
        auVar4 = vpcmpgtb_avx2(auVar7,auVar15);
        auVar15 = vpternlogq_avx512vl(auVar4,auVar4,auVar4,0xf);
        auVar4._16_8_ = uStack_1f0;
        auVar4._0_16_ = auVar2;
        auVar4._24_8_ = uStack_1e8;
        auVar4 = vpand_avx2(auVar15,auVar4);
        local_3c0 = auVar4._0_8_;
        uStack_3b8 = auVar4._8_8_;
        uStack_3b0 = auVar4._16_8_;
        uStack_3a8 = auVar4._24_8_;
        *local_548 = local_3c0;
        local_548[1] = uStack_3b8;
        local_548[2] = uStack_3b0;
        local_548[3] = uStack_3a8;
        local_548 = local_548 + 4;
      }
      if (totalSimdWidth != 0) {
        local_588 = (byte *)((long)local_3e0 + (ulong)simdWidth);
        local_590 = (undefined1 *)((long)local_3e8 + (ulong)simdWidth);
        puVar14 = local_590 + totalSimdWidth;
        for (; local_590 != puVar14; local_590 = local_590 + 1) {
          uVar13 = 0xff;
          if ((byte)outXEnd_1 < *local_588) {
            uVar13 = 0;
          }
          *local_590 = uVar13;
          local_588 = local_588 + 1;
        }
      }
      local_3e0 = (ulong *)((long)local_3e0 + (ulong)in_EDI);
    }
  }
  else {
    bVar12 = in_R9B + 0x7f;
    auVar17 = vpinsrb_avx(ZEXT116(bVar12),(uint)bVar12,1);
    auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,2);
    auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,3);
    auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,4);
    auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,5);
    auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,6);
    auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,7);
    auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,8);
    auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,9);
    auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,10);
    auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,0xb);
    auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,0xc);
    auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,0xd);
    auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,0xe);
    auVar17 = vpinsrb_avx(auVar17,(uint)bVar12,0xf);
    auVar3 = vpinsrb_avx(ZEXT116(bVar12),(uint)bVar12,1);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar12,2);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar12,3);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar12,4);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar12,5);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar12,6);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar12,7);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar12,8);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar12,9);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar12,10);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar12,0xb);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar12,0xc);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar12,0xd);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar12,0xe);
    auVar3 = vpinsrb_avx(auVar3,(uint)bVar12,0xf);
    auVar18 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar17;
    uStack_270 = auVar18._0_8_;
    uStack_268 = auVar18._8_8_;
    for (; local_3e8 != in_R8; local_3e8 = (undefined8 *)((long)local_3e8 + (ulong)in_ESI)) {
      local_4f0 = local_3e8;
      for (local_4e8 = local_3e0; local_4e8 != local_3e0 + (ulong)_maxThreshold * 4;
          local_4e8 = local_4e8 + 4) {
        auVar11._8_8_ = local_4e8[1] ^ uStack_1b8;
        auVar11._0_8_ = *local_4e8 ^ local_1c0;
        auVar11._16_8_ = local_4e8[2] ^ uStack_1b0;
        auVar11._24_8_ = local_4e8[3] ^ uStack_1a8;
        auVar10._16_8_ = uStack_230;
        auVar10._0_16_ = auVar16;
        auVar10._24_8_ = uStack_228;
        auVar4 = vpcmpgtb_avx2(auVar11,auVar10);
        auVar6._16_8_ = uStack_1f0;
        auVar6._0_16_ = auVar2;
        auVar6._24_8_ = uStack_1e8;
        auVar4 = vpandn_avx2(auVar4,auVar6);
        auVar9._8_8_ = local_4e8[1] ^ uStack_1b8;
        auVar9._0_8_ = *local_4e8 ^ local_1c0;
        auVar9._16_8_ = local_4e8[2] ^ uStack_1b0;
        auVar9._24_8_ = local_4e8[3] ^ uStack_1a8;
        auVar8._16_8_ = uStack_270;
        auVar8._0_16_ = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar3;
        auVar8._24_8_ = uStack_268;
        uVar5 = vpcmpgtb_avx512vl(auVar9,auVar8);
        auVar15 = vpmovm2b_avx512vl(uVar5);
        auVar4 = vpand_avx2(auVar4,auVar15);
        local_380 = auVar4._0_8_;
        uStack_378 = auVar4._8_8_;
        uStack_370 = auVar4._16_8_;
        uStack_368 = auVar4._24_8_;
        *local_4f0 = local_380;
        local_4f0[1] = uStack_378;
        local_4f0[2] = uStack_370;
        local_4f0[3] = uStack_368;
        local_4f0 = local_4f0 + 4;
      }
      if (totalSimdWidth != 0) {
        local_528 = (byte *)((long)local_3e0 + (ulong)simdWidth);
        local_530 = (undefined1 *)((long)local_3e8 + (ulong)simdWidth);
        puVar14 = local_530 + totalSimdWidth;
        for (; local_530 != puVar14; local_530 = local_530 + 1) {
          bVar1 = true;
          if (in_R9B <= *local_528) {
            bVar1 = (byte)outXEnd_1 < *local_528;
          }
          uVar13 = 0xff;
          if (bVar1) {
            uVar13 = 0;
          }
          *local_530 = uVar13;
          local_528 = local_528 + 1;
        }
      }
      local_3e0 = (ulong *)((long)local_3e0 + (ulong)in_EDI);
    }
  }
  return;
}

Assistant:

void Threshold( uint32_t rowSizeIn, uint32_t rowSizeOut, const uint8_t * inY, uint8_t * outY, const uint8_t * outYEnd, uint8_t minThreshold, uint8_t maxThreshold,
                    uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const char shiftMaskValue = static_cast<char>(0x80u);
        const simd shiftMask = _mm256_set_epi8(
            shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue,
            shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue,
            shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue,
            shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue, shiftMaskValue );

        const char notMaskValue = static_cast<char>(0xffu);
        const simd notMask = _mm256_set_epi8(
            notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue,
            notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue,
            notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue,
            notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue, notMaskValue );

        const char maxCompareValue = static_cast<char>(maxThreshold ^ 0x80u);
        const simd maxCompare = _mm256_set_epi8(
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue,
            maxCompareValue, maxCompareValue, maxCompareValue, maxCompareValue );

        if( minThreshold > 0 ) {
            const char minCompareValue = static_cast<char>((minThreshold - 1) ^ 0x80u);
            const simd minCompare = _mm256_set_epi8(
                minCompareValue, minCompareValue, minCompareValue, minCompareValue,
                minCompareValue, minCompareValue, minCompareValue, minCompareValue,
                minCompareValue, minCompareValue, minCompareValue, minCompareValue,
                minCompareValue, minCompareValue, minCompareValue, minCompareValue,
                minCompareValue, minCompareValue, minCompareValue, minCompareValue,
                minCompareValue, minCompareValue, minCompareValue, minCompareValue,
                minCompareValue, minCompareValue, minCompareValue, minCompareValue,
                minCompareValue, minCompareValue, minCompareValue, minCompareValue );


            for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
                const simd * src1 = reinterpret_cast <const simd*> (inY);
                simd       * dst  = reinterpret_cast <simd*> (outY);

                const simd * src1End = src1 + simdWidth;

                for( ; src1 != src1End; ++src1, ++dst ) {
                    simd data = _mm256_xor_si256( _mm256_loadu_si256( src1 ), shiftMask );

                    _mm256_storeu_si256( dst, _mm256_and_si256(
                        _mm256_andnot_si256(
                            _mm256_cmpgt_epi8( data, maxCompare ), notMask ),
                        _mm256_cmpgt_epi8( data, minCompare ) ) );
                }

                if( nonSimdWidth > 0 ) {
                    const uint8_t * inX  = inY  + totalSimdWidth;
                    uint8_t       * outX = outY + totalSimdWidth;

                    const uint8_t * outXEnd = outX + nonSimdWidth;

                    for( ; outX != outXEnd; ++outX, ++inX )
                        (*outX) = (*inX) < minThreshold || (*inX) > maxThreshold ? 0 : 255;
                }
            }
        }
        else {
            for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
                const simd * src1 = reinterpret_cast <const simd*> (inY);
                simd       * dst  = reinterpret_cast <simd*> (outY);

                const simd * src1End = src1 + simdWidth;

                for( ; src1 != src1End; ++src1, ++dst ) {
                    simd data = _mm256_xor_si256( _mm256_loadu_si256( src1 ), shiftMask );

                    _mm256_storeu_si256( dst, _mm256_andnot_si256( _mm256_cmpgt_epi8( data, maxCompare ), notMask ) );
                }

                if( nonSimdWidth > 0 ) {
                    const uint8_t * inX  = inY  + totalSimdWidth;
                    uint8_t       * outX = outY + totalSimdWidth;

                    const uint8_t * outXEnd = outX + nonSimdWidth;

                    for( ; outX != outXEnd; ++outX, ++inX )
                        (*outX) = (*inX) < minThreshold || (*inX) > maxThreshold ? 0 : 255;
                }
            }
        }
    }